

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O2

void al_store_state(ALLEGRO_STATE *state,int flags)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  ALLEGRO_FS_INTERFACE *pAVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  thread_local_state *ptVar9;
  size_t n;
  ALLEGRO_BITMAP *pAVar10;
  
  ptVar9 = tls_get();
  if (ptVar9 != (thread_local_state *)0x0) {
    *(int *)(state->_tls + 0x2d0) = flags;
    if ((flags & 1U) != 0) {
      uVar1 = *(undefined8 *)&ptVar9->new_display_adapter;
      *(undefined8 *)state->_tls = *(undefined8 *)ptVar9;
      *(undefined8 *)(state->_tls + 8) = uVar1;
      *(int *)(state->_tls + 0x10) = ptVar9->new_window_y;
      memcpy(state->_tls + 0x20,&ptVar9->new_display_settings,0xb0);
      n = strlen(ptVar9->new_window_title);
      _al_sane_strncpy(state->_tls + 0x124,ptVar9->new_window_title,n);
    }
    if ((flags & 2U) != 0) {
      *(undefined8 *)(state->_tls + 0x108) = *(undefined8 *)&ptVar9->new_bitmap_format;
    }
    if ((flags & 4U) != 0) {
      *(ALLEGRO_DISPLAY **)(state->_tls + 0xd0) = ptVar9->current_display;
    }
    if ((flags & 8U) != 0) {
      *(ALLEGRO_BITMAP **)(state->_tls + 0xd8) = ptVar9->target_bitmap;
    }
    if ((flags & 0x10U) != 0) {
      *(undefined8 *)(state->_tls + 0x248) = *(undefined8 *)&(ptVar9->current_blender).blend_color.b
      ;
      uVar1 = *(undefined8 *)&ptVar9->current_blender;
      uVar2 = *(undefined8 *)&(ptVar9->current_blender).blend_dest;
      uVar3 = *(undefined8 *)&(ptVar9->current_blender).blend_color;
      *(undefined8 *)(state->_tls + 0x238) =
           *(undefined8 *)&(ptVar9->current_blender).blend_alpha_source;
      *(undefined8 *)(state->_tls + 0x240) = uVar3;
      *(undefined8 *)(state->_tls + 0x228) = uVar1;
      *(undefined8 *)(state->_tls + 0x230) = uVar2;
    }
    if ((flags & 0x20U) != 0) {
      pAVar4 = ptVar9->fs_interface;
      *(ALLEGRO_FILE_INTERFACE **)(state->_tls + 0x110) = ptVar9->new_file_interface;
      *(ALLEGRO_FS_INTERFACE **)(state->_tls + 0x118) = pAVar4;
    }
    if ((flags & 0x40U) != 0) {
      pAVar10 = al_get_target_bitmap();
      if (pAVar10 == (ALLEGRO_BITMAP *)0x0) {
        al_identity_transform((ALLEGRO_TRANSFORM *)(state->_tls + 0x250));
      }
      else {
        uVar1 = *(undefined8 *)(pAVar10->transform).m[0];
        uVar2 = *(undefined8 *)((pAVar10->transform).m[0] + 2);
        uVar3 = *(undefined8 *)(pAVar10->transform).m[1];
        uVar5 = *(undefined8 *)((pAVar10->transform).m[1] + 2);
        uVar6 = *(undefined8 *)(pAVar10->transform).m[2];
        uVar7 = *(undefined8 *)((pAVar10->transform).m[2] + 2);
        uVar8 = *(undefined8 *)((pAVar10->transform).m[3] + 2);
        *(undefined8 *)(state->_tls + 0x280) = *(undefined8 *)(pAVar10->transform).m[3];
        *(undefined8 *)(state->_tls + 0x288) = uVar8;
        *(undefined8 *)(state->_tls + 0x270) = uVar6;
        *(undefined8 *)(state->_tls + 0x278) = uVar7;
        *(undefined8 *)(state->_tls + 0x260) = uVar3;
        *(undefined8 *)(state->_tls + 0x268) = uVar5;
        *(undefined8 *)(state->_tls + 0x250) = uVar1;
        *(undefined8 *)(state->_tls + 600) = uVar2;
      }
    }
    if (((uint)flags >> 8 & 1) != 0) {
      pAVar10 = al_get_target_bitmap();
      if (pAVar10 != (ALLEGRO_BITMAP *)0x0) {
        uVar1 = *(undefined8 *)(pAVar10->proj_transform).m[0];
        uVar2 = *(undefined8 *)((pAVar10->proj_transform).m[0] + 2);
        uVar3 = *(undefined8 *)(pAVar10->proj_transform).m[1];
        uVar5 = *(undefined8 *)((pAVar10->proj_transform).m[1] + 2);
        uVar6 = *(undefined8 *)(pAVar10->proj_transform).m[2];
        uVar7 = *(undefined8 *)((pAVar10->proj_transform).m[2] + 2);
        uVar8 = *(undefined8 *)((pAVar10->proj_transform).m[3] + 2);
        *(undefined8 *)(state->_tls + 0x2c0) = *(undefined8 *)(pAVar10->proj_transform).m[3];
        *(undefined8 *)(state->_tls + 0x2c8) = uVar8;
        *(undefined8 *)(state->_tls + 0x2b0) = uVar6;
        *(undefined8 *)(state->_tls + 0x2b8) = uVar7;
        *(undefined8 *)(state->_tls + 0x2a0) = uVar3;
        *(undefined8 *)(state->_tls + 0x2a8) = uVar5;
        *(undefined8 *)(state->_tls + 0x290) = uVar1;
        *(undefined8 *)(state->_tls + 0x298) = uVar2;
      }
    }
  }
  return;
}

Assistant:

void al_store_state(ALLEGRO_STATE *state, int flags)
{
   thread_local_state *tls;
   INTERNAL_STATE *stored;

   if ((tls = tls_get()) == NULL)
      return;

   stored = (void *)state;
   stored->flags = flags;

#define _STORE(x) (stored->tls.x = tls->x)

   if (flags & ALLEGRO_STATE_NEW_DISPLAY_PARAMETERS) {
      _STORE(new_display_flags);
      _STORE(new_display_refresh_rate);
      _STORE(new_display_adapter);
      _STORE(new_window_x);
      _STORE(new_window_y);
      _STORE(new_display_settings);
      _al_sane_strncpy(stored->tls.new_window_title, tls->new_window_title,
                       strlen(tls->new_window_title));
   }

   if (flags & ALLEGRO_STATE_NEW_BITMAP_PARAMETERS) {
      _STORE(new_bitmap_format);
      _STORE(new_bitmap_flags);
   }

   if (flags & ALLEGRO_STATE_DISPLAY) {
      _STORE(current_display);
   }

   if (flags & ALLEGRO_STATE_TARGET_BITMAP) {
      _STORE(target_bitmap);
   }

   if (flags & ALLEGRO_STATE_BLENDER) {
      stored->stored_blender = tls->current_blender;
   }

   if (flags & ALLEGRO_STATE_NEW_FILE_INTERFACE) {
      _STORE(new_file_interface);
      _STORE(fs_interface);
   }

   if (flags & ALLEGRO_STATE_TRANSFORM) {
      ALLEGRO_BITMAP *target = al_get_target_bitmap();
      if (!target)
         al_identity_transform(&stored->stored_transform);
      else
         stored->stored_transform = target->transform;
   }

   if (flags & ALLEGRO_STATE_PROJECTION_TRANSFORM) {
      ALLEGRO_BITMAP *target = al_get_target_bitmap();
      if (target) {
         stored->stored_projection_transform = target->proj_transform;
      }
   }

#undef _STORE
}